

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRVariable * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::
allocate<unsigned_int&,spv::StorageClass&,unsigned_int&>
          (ObjectPool<spirv_cross::SPIRVariable> *this,uint *p,StorageClass *p_1,uint *p_2)

{
  Vector<spirv_cross::SPIRVariable_*> *this_00;
  uint uVar1;
  StorageClass SVar2;
  uint32_t uVar3;
  size_t sVar4;
  _Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
  _Var5;
  ulong count;
  SPIRVariable *pSVar6;
  _Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> _Var7;
  
  this_00 = &this->vacants;
  if ((this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var5.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>)malloc(count * 0xb0);
    if (_Var5.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl !=
        (SPIRVariable *)0x0) {
      SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve(this_00,count);
      _Var7._M_head_impl =
           (SPIRVariable *)
           _Var5.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
      for (; count != 0; count = count - 1) {
        SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve
                  (this_00,(this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size
                           + 1);
        sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar4] =
             _Var7._M_head_impl;
        (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = sVar4 + 1;
        _Var7._M_head_impl = _Var7._M_head_impl + 1;
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                .buffer_size + 1);
      sVar4 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
      .ptr[sVar4]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> =
           _Var5.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
      .buffer_size = sVar4 + 1;
      if (_Var5.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl !=
          (SPIRVariable *)0x0) goto LAB_002a286d;
    }
    pSVar6 = (SPIRVariable *)0x0;
  }
  else {
LAB_002a286d:
    sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
    pSVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar4 - 1];
    if (sVar4 != 0) {
      SmallVector<spirv_cross::SPIRVariable_*,_0UL>::resize(this_00,sVar4 - 1);
    }
    uVar1 = *p;
    SVar2 = *p_1;
    uVar3 = *p_2;
    (pSVar6->super_IVariant).self.id = 0;
    (pSVar6->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRVariable_003604e0;
    *(uint *)&(pSVar6->super_IVariant).field_0xc = uVar1;
    pSVar6->storage = SVar2;
    pSVar6->decoration = 0;
    (pSVar6->initializer).id = uVar3;
    *(undefined8 *)&pSVar6->basevariable = 0;
    *(undefined8 *)((long)&(pSVar6->dereference_chain).super_VectorView<unsigned_int>.ptr + 4) = 0;
    (pSVar6->dereference_chain).super_VectorView<unsigned_int>.buffer_size = 0;
    (pSVar6->dereference_chain).buffer_capacity = 0;
    (pSVar6->dereference_chain).super_VectorView<unsigned_int>.ptr =
         (uint *)&(pSVar6->dereference_chain).stack_storage;
    (pSVar6->dereference_chain).buffer_capacity = 8;
    pSVar6->compat_builtin = false;
    pSVar6->statically_assigned = false;
    *(undefined8 *)&pSVar6->static_expression = 0;
    *(undefined8 *)
     ((long)&(pSVar6->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr
     + 4) = 0;
    (pSVar6->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size =
         0;
    (pSVar6->dependees).buffer_capacity = 0;
    (pSVar6->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)&(pSVar6->dependees).stack_storage;
    (pSVar6->dependees).buffer_capacity = 8;
    pSVar6->parameter = (Parameter *)0x0;
    *(undefined8 *)((long)&pSVar6->remapped_components + 3) = 0;
    pSVar6->deferred_declaration = false;
    pSVar6->phi_variable = false;
    pSVar6->allocate_temporary_copy = false;
    pSVar6->remapped_variable = false;
    pSVar6->remapped_components = 0;
  }
  return pSVar6;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}